

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_int16 *
ma_dr_wav__read_pcm_frames_and_close_s16
          (ma_dr_wav *pWav,uint *channels,uint *sampleRate,ma_uint64 *totalFrameCount)

{
  _func_void_void_ptr_void_ptr *p_Var1;
  ma_int16 *pBufferOut;
  ma_uint64 mVar2;
  
  pBufferOut = (ma_int16 *)
               ma_dr_wav__malloc_from_callbacks
                         ((ulong)pWav->channels * pWav->totalPCMFrameCount * 2,
                          &pWav->allocationCallbacks);
  if (pBufferOut != (ma_int16 *)0x0) {
    mVar2 = ma_dr_wav_read_pcm_frames_s16(pWav,pWav->totalPCMFrameCount,pBufferOut);
    if (mVar2 == pWav->totalPCMFrameCount) {
      ma_dr_wav_uninit(pWav);
      if (sampleRate != (uint *)0x0) {
        *sampleRate = pWav->sampleRate;
      }
      if (channels != (uint *)0x0) {
        *channels = (uint)pWav->channels;
      }
      if (totalFrameCount == (ma_uint64 *)0x0) {
        return pBufferOut;
      }
      *totalFrameCount = pWav->totalPCMFrameCount;
      return pBufferOut;
    }
    p_Var1 = (pWav->allocationCallbacks).onFree;
    if (p_Var1 != (_func_void_void_ptr_void_ptr *)0x0) {
      (*p_Var1)(pBufferOut,(pWav->allocationCallbacks).pUserData);
    }
  }
  ma_dr_wav_uninit(pWav);
  return (ma_int16 *)0x0;
}

Assistant:

MA_PRIVATE ma_int16* ma_dr_wav__read_pcm_frames_and_close_s16(ma_dr_wav* pWav, unsigned int* channels, unsigned int* sampleRate, ma_uint64* totalFrameCount)
{
    ma_uint64 sampleDataSize;
    ma_int16* pSampleData;
    ma_uint64 framesRead;
    MA_DR_WAV_ASSERT(pWav != NULL);
    sampleDataSize = pWav->totalPCMFrameCount * pWav->channels * sizeof(ma_int16);
    if (sampleDataSize > MA_SIZE_MAX) {
        ma_dr_wav_uninit(pWav);
        return NULL;
    }
    pSampleData = (ma_int16*)ma_dr_wav__malloc_from_callbacks((size_t)sampleDataSize, &pWav->allocationCallbacks);
    if (pSampleData == NULL) {
        ma_dr_wav_uninit(pWav);
        return NULL;
    }
    framesRead = ma_dr_wav_read_pcm_frames_s16(pWav, (size_t)pWav->totalPCMFrameCount, pSampleData);
    if (framesRead != pWav->totalPCMFrameCount) {
        ma_dr_wav__free_from_callbacks(pSampleData, &pWav->allocationCallbacks);
        ma_dr_wav_uninit(pWav);
        return NULL;
    }
    ma_dr_wav_uninit(pWav);
    if (sampleRate) {
        *sampleRate = pWav->sampleRate;
    }
    if (channels) {
        *channels = pWav->channels;
    }
    if (totalFrameCount) {
        *totalFrameCount = pWav->totalPCMFrameCount;
    }
    return pSampleData;
}